

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall comparer_context::cmp_bounds<aiQuatKey>(comparer_context *this,string *name)

{
  aiQuatKey local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  aiQuatKey local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  comparer_context *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::operator+(&local_38,name,".<minimum-value>");
  cmp<aiQuatKey>(&local_50,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_80,local_18,".<maximum-value>");
  cmp<aiQuatKey>(&local_98,this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmp_bounds(const std::string& name) {
        cmp<T> (name+".<minimum-value>");
        cmp<T> (name+".<maximum-value>");
    }